

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18dr1.cpp
# Opt level: O0

int main(void)

{
  uint32_t uVar1;
  ulong local_40;
  size_t count;
  int aa [10];
  uint32_t size;
  
  aa[9] = 0;
  aa[8] = 10;
  f(ga,10);
  for (local_40 = 0; local_40 < 10; local_40 = local_40 + 1) {
    uVar1 = fact((int)local_40 + 1);
    aa[local_40 - 2] = uVar1;
  }
  f((int *)&count,10);
  return aa[9];
}

Assistant:

int main() { 
    constexpr uint32_t size = 10;
    f(ga, size);
    int aa[size];
    for (size_t count = 0; count < size; count++) {
        aa[count] = fact(count + 1);
    }
    f(aa, size);
}